

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FixedPipelineRenderer.cpp
# Opt level: O2

void __thiscall
irr::video::COpenGL3MaterialOneTextureBlendCB::OnSetConstants
          (COpenGL3MaterialOneTextureBlendCB *this,IMaterialRendererServices *services,s32 userData)

{
  int iVar1;
  int iVar2;
  undefined4 extraout_var;
  float *pfVar3;
  matrix4 Matrix;
  
  COpenGL3MaterialBaseCB::OnSetConstants(&this->super_COpenGL3MaterialBaseCB,services,userData);
  iVar1 = (*services->_vptr_IMaterialRendererServices[0xb])(services);
  if ((this->super_COpenGL3MaterialBaseCB).field_0xb4 == '\x01') {
    iVar2 = (*services->_vptr_IMaterialRendererServices[3])(services,"uTMatrix0");
    *(int *)&(this->super_COpenGL3MaterialBaseCB).field_0xb8 = iVar2;
    iVar2 = (*services->_vptr_IMaterialRendererServices[3])(services,"uBlendType");
    *(int *)&(this->super_COpenGL3MaterialBaseCB).field_0xbc = iVar2;
    iVar2 = (*services->_vptr_IMaterialRendererServices[3])(services,"uTextureUsage0");
    *(int *)&(this->super_COpenGL3MaterialBaseCB).field_0xc0 = iVar2;
    iVar2 = (*services->_vptr_IMaterialRendererServices[3])(services,"uTextureUnit0");
    *(int *)&(this->super_COpenGL3MaterialBaseCB).field_0xc4 = iVar2;
    (this->super_COpenGL3MaterialBaseCB).field_0xb4 = 0;
  }
  pfVar3 = (float *)(**(code **)(*(long *)CONCAT44(extraout_var,iVar1) + 0x38))
                              ((long *)CONCAT44(extraout_var,iVar1),3);
  Matrix.M[0] = *pfVar3;
  Matrix.M[1] = pfVar3[1];
  Matrix.M[2] = pfVar3[2];
  Matrix.M[3] = pfVar3[3];
  Matrix.M[4] = pfVar3[4];
  Matrix.M[5] = pfVar3[5];
  Matrix.M[6] = pfVar3[6];
  Matrix.M[7] = pfVar3[7];
  Matrix.M[8] = pfVar3[8];
  Matrix.M[9] = pfVar3[9];
  Matrix.M[10] = pfVar3[10];
  Matrix.M[0xb] = pfVar3[0xb];
  Matrix.M[0xc] = pfVar3[0xc];
  Matrix.M[0xd] = pfVar3[0xd];
  Matrix.M[0xe] = pfVar3[0xe];
  Matrix.M[0xf] = pfVar3[0xf];
  (*services->_vptr_IMaterialRendererServices[8])
            (services,(ulong)*(uint *)&(this->super_COpenGL3MaterialBaseCB).field_0xb8,&Matrix,0x10)
  ;
  (*services->_vptr_IMaterialRendererServices[9])
            (services,(ulong)*(uint *)&(this->super_COpenGL3MaterialBaseCB).field_0xbc,
             &(this->super_COpenGL3MaterialBaseCB).field_0xc8,1);
  (*services->_vptr_IMaterialRendererServices[9])
            (services,(ulong)*(uint *)&(this->super_COpenGL3MaterialBaseCB).field_0xc0,
             &(this->super_COpenGL3MaterialBaseCB).field_0xcc,1);
  (*services->_vptr_IMaterialRendererServices[9])
            (services,(ulong)*(uint *)&(this->super_COpenGL3MaterialBaseCB).field_0xc4,
             &this->TextureUnit0,1);
  return;
}

Assistant:

void COpenGL3MaterialOneTextureBlendCB::OnSetConstants(IMaterialRendererServices *services, s32 userData)
{
	COpenGL3MaterialBaseCB::OnSetConstants(services, userData);

	IVideoDriver *driver = services->getVideoDriver();

	if (FirstUpdate) {
		TMatrix0ID = services->getVertexShaderConstantID("uTMatrix0");
		BlendTypeID = services->getVertexShaderConstantID("uBlendType");
		TextureUsage0ID = services->getVertexShaderConstantID("uTextureUsage0");
		TextureUnit0ID = services->getVertexShaderConstantID("uTextureUnit0");

		FirstUpdate = false;
	}

	core::matrix4 Matrix = driver->getTransform(ETS_TEXTURE_0);
	services->setPixelShaderConstant(TMatrix0ID, Matrix.pointer(), 16);

	services->setPixelShaderConstant(BlendTypeID, &BlendType, 1);
	services->setPixelShaderConstant(TextureUsage0ID, &TextureUsage0, 1);
	services->setPixelShaderConstant(TextureUnit0ID, &TextureUnit0, 1);
}